

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglMakeCurrentPerfTests.cpp
# Opt level: O1

void __thiscall deqp::egl::MakeCurrentPerfCase::destroySurfaces(MakeCurrentPerfCase *this)

{
  EGLDisplay pvVar1;
  pointer ppNVar2;
  pointer ppNVar3;
  deUint32 err;
  Library *pLVar4;
  pointer ppvVar5;
  iterator iter;
  pointer ppvVar6;
  pointer ppNVar7;
  pointer ppNVar8;
  
  pLVar4 = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
  ppvVar6 = (this->m_surfaces).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->m_surfaces).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppvVar6) {
    ppvVar5 = (this->m_surfaces).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (ppvVar6 != ppvVar5) {
      pvVar1 = this->m_display;
      do {
        if (*ppvVar6 != (void *)0x0) {
          (*pLVar4->_vptr_Library[0x16])(pLVar4,pvVar1);
          err = (*pLVar4->_vptr_Library[0x1f])(pLVar4);
          eglu::checkError(err,"destroySurface(display, *iter)",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMakeCurrentPerfTests.cpp"
                           ,0x156);
        }
        *ppvVar6 = (void *)0x0;
        ppvVar6 = ppvVar6 + 1;
        ppvVar5 = (this->m_surfaces).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      } while (ppvVar6 != ppvVar5);
    }
    ppvVar6 = (this->m_surfaces).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (ppvVar5 != ppvVar6) {
      (this->m_surfaces).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
      super__Vector_impl_data._M_finish = ppvVar6;
    }
    for (ppNVar7 = (this->m_pixmaps).
                   super__Vector_base<eglu::NativePixmap_*,_std::allocator<eglu::NativePixmap_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        ppNVar2 = (this->m_pixmaps).
                  super__Vector_base<eglu::NativePixmap_*,_std::allocator<eglu::NativePixmap_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish, ppNVar7 != ppNVar2;
        ppNVar7 = ppNVar7 + 1) {
      if (*ppNVar7 != (NativePixmap *)0x0) {
        (**(code **)(*(long *)*ppNVar7 + 8))();
      }
      *ppNVar7 = (NativePixmap *)0x0;
    }
    ppNVar7 = (this->m_pixmaps).
              super__Vector_base<eglu::NativePixmap_*,_std::allocator<eglu::NativePixmap_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (ppNVar2 != ppNVar7) {
      (this->m_pixmaps).
      super__Vector_base<eglu::NativePixmap_*,_std::allocator<eglu::NativePixmap_*>_>._M_impl.
      super__Vector_impl_data._M_finish = ppNVar7;
    }
    for (ppNVar8 = (this->m_windows).
                   super__Vector_base<eglu::NativeWindow_*,_std::allocator<eglu::NativeWindow_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        ppNVar3 = (this->m_windows).
                  super__Vector_base<eglu::NativeWindow_*,_std::allocator<eglu::NativeWindow_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish, ppNVar8 != ppNVar3;
        ppNVar8 = ppNVar8 + 1) {
      if (*ppNVar8 != (NativeWindow *)0x0) {
        (*(*ppNVar8)->_vptr_NativeWindow[1])();
      }
      *ppNVar8 = (NativeWindow *)0x0;
    }
    ppNVar8 = (this->m_windows).
              super__Vector_base<eglu::NativeWindow_*,_std::allocator<eglu::NativeWindow_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (ppNVar3 != ppNVar8) {
      (this->m_windows).
      super__Vector_base<eglu::NativeWindow_*,_std::allocator<eglu::NativeWindow_*>_>._M_impl.
      super__Vector_impl_data._M_finish = ppNVar8;
    }
    ppvVar6 = (this->m_surfaces).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((this->m_surfaces).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
        super__Vector_impl_data._M_finish != ppvVar6) {
      (this->m_surfaces).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
      super__Vector_impl_data._M_finish = ppvVar6;
    }
  }
  return;
}

Assistant:

void MakeCurrentPerfCase::destroySurfaces (void)
{
	const Library&	egl	= m_eglTestCtx.getLibrary();

	if (m_surfaces.size() > 0)
	{
		EGLDisplay display = m_display;

		// Destroy surfaces
		for (vector<EGLSurface>::iterator iter = m_surfaces.begin(); iter != m_surfaces.end(); ++iter)
		{
			if (*iter != EGL_NO_SURFACE)
				EGLU_CHECK_CALL(egl, destroySurface(display, *iter));
			*iter = EGL_NO_SURFACE;
		}

		m_surfaces.clear();

		// Destroy pixmaps
		for (vector<eglu::NativePixmap*>::iterator iter = m_pixmaps.begin(); iter != m_pixmaps.end(); ++iter)
		{
			delete *iter;
			*iter = NULL;
		}

		m_pixmaps.clear();

		// Destroy windows
		for (vector<eglu::NativeWindow*>::iterator iter = m_windows.begin(); iter != m_windows.end(); ++iter)
		{
			delete *iter;
			*iter = NULL;
		}

		m_windows.clear();

		// Clear all surface handles
		m_surfaces.clear();
	}
}